

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmprocdemo.c
# Opt level: O3

int main(void)

{
  void *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t bits;
  size_t len;
  uint rate;
  uint8_t local_19;
  ulong local_18;
  uint32_t local_c;
  
  local_c = 48000;
  snd_pcm_open(&device,"default",0,0);
  snd_pcm_hw_params_malloc(&params);
  snd_pcm_hw_params_any(device,params);
  snd_pcm_hw_params_set_access(device,params,3);
  snd_pcm_hw_params_set_format(device,params,0xe);
  snd_pcm_hw_params_set_channels(device,params,2);
  snd_pcm_hw_params_set_rate_near(device,params,&local_c,0);
  snd_pcm_hw_params(device,params);
  xm_create_context_from_libxmize(&ctx,mus,local_c);
  pvVar1 = xm_get_sample_waveform(ctx,1,0,&local_18,&local_19);
  if (0x40 < local_18) {
    uVar4 = 0x40;
    do {
      *(undefined1 *)((long)pvVar1 + uVar4) = 0x7f;
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_18);
  }
  pvVar1 = xm_get_sample_waveform(ctx,2,0,&local_18,&local_19);
  if (local_18 != 0) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      *(char *)((long)pvVar1 + uVar5) = (char)(uVar4 / local_18) + -0x80;
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + 0x100;
    } while (uVar5 < local_18);
  }
  puVar2 = (undefined8 *)xm_get_sample_waveform(ctx,4,0,&local_18,&local_19);
  *puVar2 = 0x8080808080808080;
  puVar2[1] = 0x8080808080808080;
  puVar2[2] = 0x8080808080808080;
  puVar2[3] = 0x8080808080808080;
  puVar2[4] = 0x8080808080808080;
  puVar2[5] = 0x8080808080808080;
  puVar2[6] = 0x8080808080808080;
  puVar2[7] = 0x8080808080808080;
  puVar2[8] = 0x8080808080808080;
  puVar2[9] = 0x8080808080808080;
  puVar2[10] = 0x8080808080808080;
  puVar2[0xb] = 0x8080808080808080;
  puVar2[0xc] = 0x8080808080808080;
  puVar2[0xd] = 0x8080808080808080;
  puVar2[0xe] = 0x8080808080808080;
  puVar2[0xf] = 0x8080808080808080;
  puVar2[0x10] = 0x7f7f7f7f7f7f7f7f;
  puVar2[0x11] = 0x7f7f7f7f7f7f7f7f;
  puVar2[0x12] = 0x7f7f7f7f7f7f7f7f;
  puVar2[0x13] = 0x7f7f7f7f7f7f7f7f;
  puVar2[0x14] = 0x7f7f7f7f7f7f7f7f;
  puVar2[0x15] = 0x7f7f7f7f7f7f7f7f;
  if (0xb0 < local_18) {
    uVar4 = 0xb0;
    do {
      *(undefined1 *)((long)puVar2 + uVar4) = 0x80;
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_18);
  }
  pvVar1 = xm_get_sample_waveform(ctx,8,0,&local_18,&local_19);
  if (local_18 != 0) {
    iVar3 = 1;
    uVar4 = 0;
    do {
      iVar3 = iVar3 * 0x1fbf + 1;
      *(char *)((long)pvVar1 + uVar4) = (char)((uint)iVar3 >> 0x10);
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_18);
  }
  snd_pcm_prepare(device);
  do {
    xm_generate_samples(ctx,buffer,0x800);
    snd_pcm_writei(device,buffer,0x800);
  } while( true );
}

Assistant:

int main(void) {
	unsigned int rate = 48000;

	snd_pcm_open(&device, "default", SND_PCM_STREAM_PLAYBACK, 0);
	snd_pcm_hw_params_malloc(&params);
	snd_pcm_hw_params_any(device, params);
	snd_pcm_hw_params_set_access(device, params, SND_PCM_ACCESS_RW_INTERLEAVED);
	snd_pcm_hw_params_set_format(device, params, SND_PCM_FORMAT_FLOAT);
	snd_pcm_hw_params_set_channels(device, params, 2);
	snd_pcm_hw_params_set_rate_near(device, params, &rate, NULL);
	snd_pcm_hw_params(device, params);

	xm_create_context_from_libxmize(&ctx, mus, rate);
	gen_waveforms();

	snd_pcm_prepare(device);

	while(1) {
		xm_generate_samples(ctx, buffer, 2048);
		snd_pcm_writei(device, buffer, 2048);
	}

	return 0;
}